

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Monotonicity.cpp
# Opt level: O1

void __thiscall FMB::Monotonicity::monotone(Monotonicity *this,Clause *c,Literal *l)

{
  uint uVar1;
  ulong uVar2;
  Entry *pEVar3;
  uint uVar4;
  uint *key;
  DHMap<unsigned_int,_SAT::SATLiteral,_Lib::DefaultHash,_Lib::DefaultHash2> *this_00;
  long lVar5;
  uint uVar6;
  uint local_38;
  uint local_34;
  
  uVar4 = (l->super_Term)._functor;
  uVar2 = (l->super_Term)._args[0]._content;
  if (uVar4 == 0) {
    if ((uVar2 & 4) != 0) {
      uVar2 = (ulong)(*(uint *)&(l->super_Term).field_0xc & 0xfffffff);
      safe(this,c,l,(l->super_Term)._args + uVar2);
      safe(this,c,l,(l->super_Term)._args + (uVar2 - 1));
      return;
    }
  }
  else {
    if ((uVar2 & 4) == 0) {
      this_00 = &this->_pT;
      key = &local_34;
    }
    else {
      this_00 = &this->_pF;
      key = &local_38;
    }
    *key = uVar4;
    pEVar3 = ::Lib::DHMap<unsigned_int,_SAT::SATLiteral,_Lib::DefaultHash,_Lib::DefaultHash2>::
             findEntry(this_00,key);
    uVar4 = *(uint *)&(l->super_Term).field_0xc & 0xfffffff;
    if (uVar4 != 0) {
      uVar1 = (pEVar3->_val).field_0._content;
      lVar5 = 0;
      uVar6 = 0;
      do {
        safe(this,c,l,(l->super_Term)._args + (ulong)uVar4 + lVar5,(SATLiteral)(uVar1 ^ 1));
        uVar6 = uVar6 + 1;
        uVar4 = *(uint *)&(l->super_Term).field_0xc & 0xfffffff;
        lVar5 = lVar5 + -1;
      } while (uVar6 < uVar4);
    }
  }
  return;
}

Assistant:

void Monotonicity::monotone(Clause* c, Literal* l)
{
  // if we have equality
  if(l->isEquality()){
    TermList* t1 = l->nthArgument(0);
    TermList* t2 = l->nthArgument(1);
    // t1 = t2
    if(l->polarity()){
      // add a clause for each
      safe(c,l,t1);
      safe(c,l,t2);
    }
    // t1 != t2
    else{
      // the true clause, skip
    }
  }
  else{
  // not equality
    unsigned p = l->functor();
    SATLiteral add = (l->polarity() ? _pF.get(p) : _pT.get(p)).opposite();
    for(unsigned i=0;i<l->arity();i++){
      TermList* t = l->nthArgument(i);
      safe(c,l,t,add);
    }
  }
}